

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

_Bool find_any_nearby_injured_kin(chunk *c,monster_conflict *mon)

{
  monster_conflict *pmVar1;
  loc grid;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  
  wVar3 = (mon->grid).y;
  for (wVar4 = wVar3 + L'\xfffffffb'; wVar4 <= wVar3 + L'\x05'; wVar4 = wVar4 + L'\x01') {
    wVar2 = (mon->grid).x + L'\xfffffffb';
    while (wVar2 <= (mon->grid).x + L'\x05') {
      grid.y = wVar4;
      grid.x = wVar2;
      pmVar1 = get_injured_kin(c,mon,grid);
      wVar2 = wVar2 + L'\x01';
      if (pmVar1 != (monster_conflict *)0x0) goto LAB_00174036;
    }
    wVar3 = (mon->grid).y;
  }
LAB_00174036:
  return wVar4 <= wVar3 + L'\x05';
}

Assistant:

bool find_any_nearby_injured_kin(struct chunk *c, const struct monster *mon)
{
	struct loc grid;
	for (grid.y = mon->grid.y - MAX_KIN_RADIUS;
		 grid.y <= mon->grid.y + MAX_KIN_RADIUS; grid.y++) {
		for (grid.x = mon->grid.x - MAX_KIN_RADIUS;
			 grid.x <= mon->grid.x + MAX_KIN_RADIUS; grid.x++) {
			if (get_injured_kin(c, mon, grid) != NULL) {
				return true;
			}
		}
	}

	return false;
}